

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O0

pint p_test_case_sha1_test(void)

{
  pint pVar1;
  puchar local_78 [8];
  puchar hash_etalon_3 [20];
  puchar local_58 [8];
  puchar hash_etalon_2 [20];
  puchar local_38 [8];
  puchar hash_etalon_1 [20];
  
  p_test_module_fail_counter = 0;
  local_38[0] = 0xa9;
  local_38[1] = 0x99;
  local_38[2] = '>';
  local_38[3] = '6';
  local_38[4] = 'G';
  local_38[5] = '\x06';
  local_38[6] = 0x81;
  local_38[7] = 'j';
  hash_etalon_1[0] = 0xba;
  hash_etalon_1[1] = '>';
  hash_etalon_1[2] = '%';
  hash_etalon_1[3] = 'q';
  hash_etalon_1[4] = 'x';
  hash_etalon_1[5] = 'P';
  hash_etalon_1[6] = 0xc2;
  hash_etalon_1[7] = 'l';
  hash_etalon_1[8] = 0x9c;
  hash_etalon_1[9] = 0xd0;
  hash_etalon_1[10] = 0xd8;
  hash_etalon_1[0xb] = 0x9d;
  local_58[0] = 0x84;
  local_58[1] = 0x98;
  local_58[2] = '>';
  local_58[3] = 'D';
  local_58[4] = '\x1c';
  local_58[5] = ';';
  local_58[6] = 0xd2;
  local_58[7] = 'n';
  hash_etalon_2[0] = 0xba;
  hash_etalon_2[1] = 0xae;
  hash_etalon_2[2] = 'J';
  hash_etalon_2[3] = 0xa1;
  hash_etalon_2[4] = 0xf9;
  hash_etalon_2[5] = 'Q';
  hash_etalon_2[6] = ')';
  hash_etalon_2[7] = 0xe5;
  hash_etalon_2[8] = 0xe5;
  hash_etalon_2[9] = 'F';
  hash_etalon_2[10] = 'p';
  hash_etalon_2[0xb] = 0xf1;
  local_78[0] = '4';
  local_78[1] = 0xaa;
  local_78[2] = 0x97;
  local_78[3] = '<';
  local_78[4] = 0xd4;
  local_78[5] = 0xc4;
  local_78[6] = 0xda;
  local_78[7] = 0xa4;
  hash_etalon_3[0] = 0xf6;
  hash_etalon_3[1] = '\x1e';
  hash_etalon_3[2] = 0xeb;
  hash_etalon_3[3] = '+';
  hash_etalon_3[4] = 0xdb;
  hash_etalon_3[5] = 0xad;
  hash_etalon_3[6] = '\'';
  hash_etalon_3[7] = '1';
  hash_etalon_3[8] = 'e';
  hash_etalon_3[9] = '4';
  hash_etalon_3[10] = '\x01';
  hash_etalon_3[0xb] = 'o';
  p_libsys_init();
  general_hash_test(P_CRYPTO_HASH_TYPE_SHA1,0x14,"abc",
                    "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",local_38,local_58,
                    local_78,"a9993e364706816aba3e25717850c26c9cd0d89d",
                    "84983e441c3bd26ebaae4aa1f95129e5e54670f1",
                    "34aa973cd4c4daa4f61eeb2bdbad27316534016f",
                    "56309c2dbe04a348ec801ca5f40b035bad01f907");
  p_libsys_shutdown();
  pVar1 = -1;
  if (p_test_module_fail_counter == 0) {
    pVar1 = 0;
  }
  return pVar1;
}

Assistant:

P_TEST_CASE_BEGIN (sha1_test)
{
	const puchar	hash_etalon_1[] = {169, 153,  62,  54,  71,   6, 129, 106,
					   186,  62,  37, 113, 120,  80, 194, 108,
					   156, 208, 216, 157};
	const puchar	hash_etalon_2[] = {132, 152,  62,  68,  28,  59, 210, 110,
					   186, 174,  74, 161, 249,  81,  41, 229,
					   229,  70, 112, 241};
	const puchar	hash_etalon_3[] = { 52, 170, 151,  60, 212, 196, 218, 164,
					   246,  30, 235,  43, 219, 173,  39,  49,
					   101,  52,   1, 111};

	p_libsys_init ();

	general_hash_test (P_CRYPTO_HASH_TYPE_SHA1,
			   20,
			   "abc",
			   "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
			   hash_etalon_1,
			   hash_etalon_2,
			   hash_etalon_3,
			   "a9993e364706816aba3e25717850c26c9cd0d89d",
			   "84983e441c3bd26ebaae4aa1f95129e5e54670f1",
			   "34aa973cd4c4daa4f61eeb2bdbad27316534016f",
			   "56309c2dbe04a348ec801ca5f40b035bad01f907");

	p_libsys_shutdown ();
}